

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall duckdb_re2::Compiler::Plus(Compiler *this,Frag a,bool nongreedy)

{
  uint uVar1;
  undefined8 uVar2;
  uint uVar3;
  Inst *pIVar4;
  uint32_t out;
  Frag FVar5;
  uint uStack_58;
  uint uStack_54;
  uint uStack_3c;
  
  uVar1 = AllocInst(this,1);
  if ((int)uVar1 < 0) {
    uVar2 = 0;
    uStack_58 = 0;
    uStack_54 = (uint)uStack_54._1_3_ << 8;
  }
  else {
    pIVar4 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl + uVar1;
    uStack_58 = uVar1 * 2;
    out = a.begin;
    if (nongreedy) {
      Prog::Inst::InitAlt(pIVar4,0,out);
    }
    else {
      Prog::Inst::InitAlt(pIVar4,out,0);
      uStack_58 = uStack_58 | 1;
    }
    uStack_3c = a.end.head;
    if (uStack_3c != 0) {
      pIVar4 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      do {
        uVar3 = uStack_3c >> 1;
        if ((uStack_3c & 1) == 0) {
          uStack_3c = pIVar4[uVar3].out_opcode_ >> 4;
          pIVar4[uVar3].out_opcode_ = pIVar4[uVar3].out_opcode_ & 0xf | uVar1 << 4;
        }
        else {
          uStack_3c = pIVar4[uVar3].field_1.out1_;
          pIVar4[uVar3].field_1.cap_ = uVar1;
        }
      } while (uStack_3c != 0);
    }
    uStack_54 = CONCAT31(uStack_54._1_3_,a.nullable) & 0xffffff01;
    uVar2 = CONCAT44(uStack_58,out);
  }
  FVar5._12_4_ = uStack_54;
  FVar5.end.tail = uStack_58;
  FVar5.begin = (int)uVar2;
  FVar5.end.head = (int)((ulong)uVar2 >> 0x20);
  return FVar5;
}

Assistant:

Frag Compiler::Plus(Frag a, bool nongreedy) {
  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();
  PatchList pl;
  if (nongreedy) {
    inst_[id].InitAlt(0, a.begin);
    pl = PatchList::Mk(id << 1);
  } else {
    inst_[id].InitAlt(a.begin, 0);
    pl = PatchList::Mk((id << 1) | 1);
  }
  PatchList::Patch(inst_.data(), a.end, id);
  return Frag(a.begin, pl, a.nullable);
}